

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

DebuggerScope * __thiscall
Js::FunctionBody::RecordStartScopeObject
          (FunctionBody *this,DiagExtraScopesType scopeType,int start,RegSlot scopeLocation,
          int *index)

{
  Type index_00;
  Recycler *this_00;
  undefined8 address;
  bool bVar1;
  Recycler *alloc;
  ScopeObjectChain *this_01;
  undefined1 auVar2 [8];
  undefined1 local_68 [8];
  TrackAllocData data;
  
  if ((this->m_sourceInfo).pScopeObjectChain.ptr == (ScopeObjectChain *)0x0) {
    data._32_8_ = &(this->m_sourceInfo).pScopeObjectChain;
    this_00 = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->recycler;
    local_68 = (undefined1  [8])&ScopeObjectChain::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2ab02c8;
    data.filename._0_4_ = 0x1ed0;
    alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_68);
    this_01 = (ScopeObjectChain *)new<Memory::Recycler>(8,alloc,0x387914);
    ScopeObjectChain::ScopeObjectChain(this_01,this_00);
    address = data._32_8_;
    Memory::Recycler::WBSetBit((char *)data._32_8_);
    (this->m_sourceInfo).pScopeObjectChain.ptr = this_01;
    Memory::RecyclerWriteBarrierManager::WriteBarrier((void *)address);
  }
  local_68 = (undefined1  [8])0x0;
  index_00 = this->debuggerScopeIndex;
  this->debuggerScopeIndex = index_00 + 1;
  bVar1 = TryGetDebuggerScopeAt(this,index_00,(DebuggerScope **)local_68);
  auVar2 = local_68;
  if (bVar1) {
    DebuggerScope::UpdateDueToByteCodeRegeneration
              ((DebuggerScope *)local_68,scopeType,start,scopeLocation);
  }
  else {
    auVar2 = (undefined1  [8])AddScopeObject(this,scopeType,start,scopeLocation);
  }
  if (index != (int *)0x0) {
    *index = index_00;
  }
  return (DebuggerScope *)auVar2;
}

Assistant:

DebuggerScope* FunctionBody::RecordStartScopeObject(DiagExtraScopesType scopeType, int start, RegSlot scopeLocation, int* index)
    {
        Recycler* recycler = m_scriptContext->GetRecycler();

        if (!GetScopeObjectChain())
        {
            SetScopeObjectChain(RecyclerNew(recycler, ScopeObjectChain, recycler));
        }

        // Check if we need to create the scope object or if it already exists from a previous bytecode
        // generator pass.
        DebuggerScope* debuggerScope = nullptr;
        int currentDebuggerScopeIndex = this->GetNextDebuggerScopeIndex();
        if (!this->TryGetDebuggerScopeAt(currentDebuggerScopeIndex, debuggerScope))
        {
            // Create a new debugger scope.
            debuggerScope = AddScopeObject(scopeType, start, scopeLocation);
        }
        else
        {
            debuggerScope->UpdateDueToByteCodeRegeneration(scopeType, start, scopeLocation);
        }

        if(index)
        {
            *index = currentDebuggerScopeIndex;
        }

        return debuggerScope;
    }